

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlReinitialize(Ssw_Sml_t *p)

{
  Aig_Man_t *pAVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  iVar3 = p->pAig->nRegs;
  if (iVar3 < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0x3bf,"void Ssw_SmlReinitialize(Ssw_Sml_t *)");
  }
  if (p->pAig->nObjs[2] <= iVar3) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0x3c0,"void Ssw_SmlReinitialize(Ssw_Sml_t *)");
  }
  pAVar1 = p->pAig;
  if (0 < pAVar1->nTruePis) {
    lVar5 = 0;
    do {
      if (pAVar1->vCis->nSize <= lVar5) goto LAB_006afe7a;
      Ssw_SmlAssignRandom(p,(Aig_Obj_t *)pAVar1->vCis->pArray[lVar5]);
      lVar5 = lVar5 + 1;
      pAVar1 = p->pAig;
    } while (lVar5 < pAVar1->nTruePis);
  }
  pAVar1 = p->pAig;
  if (0 < pAVar1->nRegs) {
    iVar3 = 0;
    do {
      uVar2 = pAVar1->nTruePos + iVar3;
      if (((((int)uVar2 < 0) || (pAVar1->vCos->nSize <= (int)uVar2)) ||
          (uVar4 = pAVar1->nTruePis + iVar3, (int)uVar4 < 0)) || (pAVar1->vCis->nSize <= (int)uVar4)
         ) {
LAB_006afe7a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Ssw_SmlNodeTransferFirst
                (p,(Aig_Obj_t *)pAVar1->vCos->pArray[uVar2],(Aig_Obj_t *)pAVar1->vCis->pArray[uVar4]
                );
      iVar3 = iVar3 + 1;
      pAVar1 = p->pAig;
    } while (iVar3 < pAVar1->nRegs);
  }
  return;
}

Assistant:

void Ssw_SmlReinitialize( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    // assign random info for primary inputs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_SmlAssignRandom( p, pObj );
    // copy simulation info into the inputs
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        Ssw_SmlNodeTransferFirst( p, pObjLi, pObjLo );
}